

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O0

void hide_resize_helper(natwm_state *state)

{
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 local_30;
  xcb_configure_window_value_list_t values;
  uint16_t mask;
  natwm_state *state_local;
  
  if (state->button_state->resize_helper != 0) {
    values.sibling._2_2_ = 0x5f;
    local_30 = 0xffffffffffffffff;
    values.x = 1;
    values.y = 1;
    values.width = 0;
    values.height = 0;
    values.border_width = 1;
    unique0x1000007a = state;
    xcb_configure_window_aux
              (state->xcb,state->button_state->resize_helper,0x5f,&local_30,in_R8,in_R9,0x105b41);
    xcb_flush(stack0xfffffffffffffff0->xcb);
  }
  return;
}

Assistant:

static void hide_resize_helper(const struct natwm_state *state)
{
        if (state->button_state->resize_helper == XCB_NONE) {
                return;
        }

        uint16_t mask = XCB_CONFIG_WINDOW_X | XCB_CONFIG_WINDOW_Y | XCB_CONFIG_WINDOW_WIDTH
                | XCB_CONFIG_WINDOW_HEIGHT | XCB_CONFIG_WINDOW_BORDER_WIDTH
                | XCB_CONFIG_WINDOW_STACK_MODE;
        xcb_configure_window_value_list_t values = {
                .x = -1,
                .y = -1,
                .width = 1,
                .height = 1,
                .border_width = 0,
                .stack_mode = XCB_STACK_MODE_BELOW,
        };

        xcb_configure_window_aux(state->xcb, state->button_state->resize_helper, mask, &values);

        xcb_flush(state->xcb);
}